

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O1

bool __thiscall axl::io::MappedFile::setSize(MappedFile *this,uint64_t size)

{
  int iVar1;
  bool bVar2;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_38;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_20;
  
  if ((this->m_dynamicViewMgr).m_viewList.
      super_OwningListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::MappedViewMgr::ViewEntry>_>
      .
      super_ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
      .super_ListData<axl::io::MappedViewMgr::ViewEntry>.m_head == (ViewEntry *)0x0 &&
      (this->m_permanentViewMgr).m_viewList.
      super_OwningListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::MappedViewMgr::ViewEntry>_>
      .
      super_ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
      .super_ListData<axl::io::MappedViewMgr::ViewEntry>.m_head == (ViewEntry *)0x0) {
    iVar1 = ftruncate64((this->m_file).m_file.
                        super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h,size
                       );
    bVar2 = iVar1 != -1;
    if (!bVar2) {
      err::setLastSystemError();
    }
  }
  else {
    err::Error::Error((Error *)&local_20,0x10);
    local_38.m_p = (ErrorHdr *)0x0;
    local_38.m_hdr = (BufHdr *)0x0;
    local_38.m_size = 0;
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_38,&local_20);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_20);
    err::setError((ErrorRef *)&local_38);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_38);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
MappedFile::setSize(uint64_t size) {
	if (!m_permanentViewMgr.isEmpty() ||
		!m_dynamicViewMgr.isEmpty()) {
		err::setError(err::SystemErrorCode_InvalidDeviceState);
		return false;
	}

	return m_file.setSize(size);
}